

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_long>::__decodeArray
          (FastPForImpl<8U,_unsigned_long> *this,uint32_t *in,size_t *length,unsigned_long *out,
          size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  pointer pvVar5;
  uint32_t *source;
  int iVar6;
  unsigned_long *puVar7;
  uint32_t *puVar8;
  uint32_t run;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  unsigned_long *apuStack_a30 [247];
  uint32_t *local_278;
  const_iterator unpackpointers [65];
  
  puVar8 = in + (ulong)*in + 1;
  local_278 = (uint32_t *)
              ((long)in + ((ulong)puVar8[-1] + 3 & 0xfffffffffffffffc) + 0xc + (ulong)*in * 4);
  uVar10 = *(ulong *)(local_278 + -2);
  iVar6 = 2;
  lVar9 = 0x30;
  for (lVar11 = -0x3f; lVar11 != 0; lVar11 = lVar11 + 1) {
    if ((uVar10 >> ((ulong)(iVar6 - 1U & 0xff) & 0x3f) & 1) != 0) {
      uVar12 = *local_278;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar9),(ulong)(uVar12 + 0x1f & 0xffffffe0));
      pvVar5 = (this->datatobepacked).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(unsigned_long **)
                ((long)&(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data + lVar9);
      local_278 = packingvector<32U>::unpackmetight<unsigned_long>
                            (local_278,puVar7,
                             *(long *)((long)&(pvVar5->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data + lVar9 + 8) -
                             (long)puVar7 >> 3,(int)lVar11 + 0x41);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar9),(ulong)uVar12);
    }
    iVar6 = iVar6 + 1;
    lVar9 = lVar9 + 0x18;
  }
  *length = (long)local_278 - (long)in >> 2;
  memset(unpackpointers,0,0x208);
  pvVar5 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar11 = 1; pvVar5 = pvVar5 + 1, lVar11 != 0x41; lVar11 = lVar11 + 1) {
    unpackpointers[lVar11]._M_current =
         (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  source = in + 1;
  for (uVar10 = 0; uVar10 < nvalue >> 8; uVar10 = (ulong)((int)uVar10 + 1)) {
    bVar2 = (byte)*puVar8;
    bVar3 = *(byte *)((long)puVar8 + 1);
    uVar12 = (uint)bVar3;
    source = unpackblock<256u,unsigned_long>(source,out,(uint)bVar2);
    if (bVar3 == 0) {
      puVar8 = (uint32_t *)((long)puVar8 + 2);
    }
    else {
      pbVar1 = (byte *)((long)puVar8 + 2);
      puVar8 = (uint32_t *)((long)puVar8 + 3);
      lVar11 = (ulong)*pbVar1 - (ulong)bVar2;
      if ((int)lVar11 == 1) {
        while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
          uVar4 = *puVar8;
          puVar8 = (uint32_t *)((long)puVar8 + 1);
          out[(byte)uVar4] = out[(byte)uVar4] | 1L << ((ulong)bVar2 & 0x3f);
        }
      }
      else {
        puVar7 = unpackpointers[lVar11]._M_current;
        while( true ) {
          bVar13 = uVar12 == 0;
          uVar12 = uVar12 - 1;
          if (bVar13) break;
          uVar4 = *puVar8;
          unpackpointers[lVar11]._M_current = puVar7 + 1;
          puVar8 = (uint32_t *)((long)puVar8 + 1);
          out[(byte)uVar4] = out[(byte)uVar4] | *puVar7 << ((ulong)bVar2 & 0x3f);
          puVar7 = puVar7 + 1;
        }
      }
    }
    out = out + 0x100;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, IntType *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    IntType bitmap = *(reinterpret_cast<const IntType *>(inexcept));
    inexcept += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if ((bitmap & (1ULL << (k - 1))) != 0) {
        uint32_t tnvalue = *inexcept;
        datatobepacked[k].resize((tnvalue + PACKSIZE - 1) / PACKSIZE * PACKSIZE);
        inexcept = packingvector<32>::unpackmetight(
            inexcept, datatobepacked[k].data(), datatobepacked[k].size(), k);
        datatobepacked[k].resize(tnvalue);
      }
    }
    length = inexcept - initin;
    typename std::vector<IntType>::const_iterator
        unpackpointers[sizeof(IntType) * 8 + 1];
    for (uint32_t k = 1; k <= sizeof(IntType) * 8; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint64_t>(1) << b;
          }
        } else {
          typename std::vector<IntType>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (static_cast<uint64_t>(*(exceptionsptr++))) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }